

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

uchar * stbi__load_and_postprocess_8bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar *__ptr;
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  uint uVar5;
  long *in_FS_OFFSET;
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (uchar *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,8);
  if (__ptr == (uchar *)0x0) {
    __ptr = (uchar *)0x0;
  }
  else {
    if (local_3c.bits_per_channel != 8) {
      iVar2 = req_comp;
      if (req_comp == 0) {
        iVar2 = *comp;
      }
      uVar5 = *y * *x * iVar2;
      puVar1 = (uchar *)malloc((long)(int)uVar5);
      if (puVar1 == (uchar *)0x0) {
        in_FS_OFFSET[-2] = (long)"outofmem";
        __ptr = puVar1;
      }
      else {
        if (0 < (int)uVar5) {
          uVar3 = 0;
          do {
            puVar1[uVar3] = __ptr[uVar3 * 2 + 1];
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
        free(__ptr);
        __ptr = puVar1;
      }
    }
    piVar4 = &stbi__vertically_flip_on_load_global;
    if (*(int *)((long)in_FS_OFFSET + -4) != 0) {
      piVar4 = (int *)(*in_FS_OFFSET + -8);
    }
    if (*piVar4 != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(__ptr,*x,*y,req_comp);
    }
  }
  return __ptr;
}

Assistant:

static unsigned char *stbi__load_and_postprocess_8bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 8);

   if (result == NULL)
      return NULL;

   if (ri.bits_per_channel != 8) {
      STBI_ASSERT(ri.bits_per_channel == 16);
      result = stbi__convert_16_to_8((stbi__uint16 *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 8;
   }

   // @TODO: move stbi__convert_format to here

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi_uc));
   }

   return (unsigned char *) result;
}